

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  long lVar5;
  int iVar6;
  nn_trie_node *pnVar7;
  void *pvVar8;
  undefined4 *puVar9;
  nn_trie_node *pnVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  size_t sVar19;
  
  pnVar10 = self->root;
  while( true ) {
    if (pnVar10 == (nn_trie_node *)0x0) goto LAB_001208be;
    iVar6 = nn_node_check_prefix(pnVar10,data,size);
    sVar19 = (size_t)iVar6;
    pbVar14 = data + sVar19;
    if (iVar6 < (int)(uint)pnVar10->prefix_len) break;
    if (size == sVar19) goto LAB_0012064c;
    pnVar7 = (nn_trie_node *)nn_node_next(pnVar10,*pbVar14);
    if ((pnVar7 == (nn_trie_node *)0x0) ||
       (pnVar10 = *(nn_trie_node **)pnVar7, pnVar10 == (nn_trie_node *)0x0)) goto LAB_00120647;
    data = pbVar14 + 1;
    size = (size - sVar19) - 1;
    self = (nn_trie *)pnVar7;
  }
  puVar9 = (undefined4 *)nn_alloc_(0x20);
  *self = (nn_trie)puVar9;
  *puVar9 = 0;
  *(byte *)((long)puVar9 + 5) = (byte)iVar6;
  *(undefined1 *)(puVar9 + 1) = 1;
  memcpy((void *)((long)puVar9 + 6),pnVar10->prefix,sVar19);
  *(uint8_t *)(*(long *)self + 0x10) = pnVar10->prefix[sVar19];
  bVar11 = ~(byte)iVar6 + pnVar10->prefix_len;
  pnVar10->prefix_len = bVar11;
  memmove(pnVar10->prefix,pnVar10->prefix + sVar19 + 1,(ulong)bVar11);
  pnVar10 = nn_node_compact(pnVar10);
  *(nn_trie_node **)(*(long *)self + 0x18) = pnVar10;
LAB_00120647:
  if (size == sVar19) goto LAB_0012064c;
  pvVar8 = self->root;
  uVar17 = (ulong)*(byte *)((long)pvVar8 + 4);
  if (uVar17 < 8) {
    pvVar8 = nn_realloc(pvVar8,uVar17 * 8 + 0x20);
    *self = (nn_trie)pvVar8;
    *(byte *)((long)pvVar8 + (ulong)*(byte *)((long)pvVar8 + 4) + 0x10) = *pbVar14;
    lVar5 = *(long *)self;
    bVar11 = *(char *)(lVar5 + 4) + 1;
    *(byte *)(lVar5 + 4) = bVar11;
    self = (nn_trie *)(lVar5 + (ulong)bVar11 * 8 + 0x10);
    ((nn_trie_node *)self)->refcount = 0;
    ((nn_trie_node *)self)->type = '\0';
    ((nn_trie_node *)self)->prefix_len = '\0';
    ((nn_trie_node *)self)->prefix[0] = '\0';
    ((nn_trie_node *)self)->prefix[1] = '\0';
  }
  else if (*(byte *)((long)pvVar8 + 4) == 9) {
    bVar11 = *pbVar14;
    bVar1 = *(byte *)((long)pvVar8 + 0x10);
    bVar2 = *(byte *)((long)pvVar8 + 0x11);
    if ((bVar11 < bVar1) || (bVar2 < bVar11)) {
      if (bVar11 <= bVar1) {
        bVar1 = bVar11;
      }
      if (bVar2 <= bVar11) {
        bVar2 = bVar11;
      }
      iVar6 = (uint)bVar2 - (uint)bVar1;
      pvVar8 = nn_realloc(pvVar8,(long)iVar6 * 8 + 0x20);
      *self = (nn_trie)pvVar8;
      bVar3 = *(byte *)((long)pvVar8 + 0x10);
      lVar12 = (ulong)*(byte *)((long)pvVar8 + 0x11) - (ulong)bVar3;
      lVar5 = lVar12 + 1;
      if (bVar3 == bVar1) {
        pvVar8 = (void *)((long)pvVar8 + (long)(int)lVar5 * 8);
        lVar12 = (long)(iVar6 - (int)lVar12);
      }
      else {
        lVar12 = (long)(int)((uint)bVar3 - (uint)bVar1);
        memmove((void *)((long)pvVar8 + lVar12 * 8 + 0x18),(void *)((long)pvVar8 + 0x18),lVar5 * 8);
        pvVar8 = self->root;
      }
      memset((void *)((long)pvVar8 + 0x18),0,lVar12 << 3);
      *(byte *)(*(long *)self + 0x10) = bVar1;
      *(byte *)(*(long *)self + 0x11) = bVar2;
      pvVar8 = self->root;
    }
    *(short *)((long)pvVar8 + 0x12) = *(short *)((long)pvVar8 + 0x12) + 1;
    self = (nn_trie *)
           (*(long *)self + ((ulong)bVar11 - (ulong)*(byte *)(*(long *)self + 0x10)) * 8 + 0x18);
  }
  else {
    uVar18 = 0xff;
    uVar13 = 0;
    uVar15 = 0;
    while( true ) {
      if (uVar17 == uVar13) break;
      bVar11 = *(byte *)((long)pvVar8 + uVar13 + 0x10);
      if (bVar11 <= (byte)uVar18) {
        uVar18 = (uint)bVar11;
      }
      uVar16 = (uint)bVar11;
      if (bVar11 < (byte)uVar15) {
        uVar16 = uVar15;
      }
      uVar13 = uVar13 + 1;
      uVar15 = uVar16;
    }
    bVar11 = *pbVar14;
    if (bVar11 <= (byte)uVar18) {
      uVar18 = (uint)bVar11;
    }
    uVar16 = (uint)bVar11;
    if (bVar11 < (byte)uVar15) {
      uVar16 = uVar15;
    }
    puVar9 = (undefined4 *)nn_alloc_((long)(int)(uVar16 - uVar18) * 8 + 0x20);
    *self = (nn_trie)puVar9;
    *puVar9 = 0;
    bVar11 = *(byte *)((long)pvVar8 + 5);
    *(byte *)((long)puVar9 + 5) = bVar11;
    *(undefined1 *)(puVar9 + 1) = 9;
    memcpy((void *)((long)puVar9 + 6),(void *)((long)pvVar8 + 6),(ulong)bVar11);
    *(char *)(*(long *)self + 0x10) = (char)uVar18;
    *(char *)(*(long *)self + 0x11) = (char)uVar16;
    *(ushort *)(*(long *)self + 0x12) = *(byte *)((long)pvVar8 + 4) + 1;
    memset((void *)(*(long *)self + 0x18),0,(long)(int)(uVar16 - uVar18) * 8 + 8);
    bVar11 = *(byte *)((long)pvVar8 + 4);
    for (uVar17 = 0; bVar11 != uVar17; uVar17 = uVar17 + 1) {
      *(undefined8 *)
       (*(long *)self + 0x18 + ((ulong)*(byte *)((long)pvVar8 + uVar17 + 0x10) - (ulong)uVar18) * 8)
           = *(undefined8 *)((long)pvVar8 + uVar17 * 8 + 0x18);
    }
    self = (nn_trie *)nn_node_next(self->root,*pbVar14);
    nn_free(pvVar8);
  }
  size = (size - sVar19) - 1;
  data = pbVar14 + 1;
LAB_001208be:
  while( true ) {
    pnVar10 = (nn_trie_node *)nn_alloc_((ulong)(10 < size) * 8 + 0x18);
    *self = (nn_trie)pnVar10;
    pnVar10->type = 10 < size;
    pnVar10->refcount = 0;
    sVar19 = 10;
    if (size < 10) {
      sVar19 = size;
    }
    pnVar10->prefix_len = (uint8_t)sVar19;
    memcpy(pnVar10->prefix,data,sVar19);
    if (size < 0xb) break;
    uVar17 = (ulong)self->root->prefix_len;
    pbVar14 = data + uVar17;
    data = pbVar14 + 1;
    (self->root->u).sparse.children[0] = *pbVar14;
    self = (nn_trie *)(self->root + 1);
    size = size + ~uVar17;
  }
LAB_0012064c:
  uVar4 = self->root->refcount;
  self->root->refcount = uVar4 + 1;
  return (int)(uVar4 == 0);
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}